

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O1

void __thiscall RK8::Integrate(RK8 *this)

{
  double t;
  double h;
  clock_t cVar1;
  clock_t cVar2;
  int iVar3;
  Mat input;
  Mat local_70;
  Mat local_60;
  Mat local_50;
  Mat local_40;
  
  cVar1 = clock();
  *(undefined8 *)(this + 0x28) = *(undefined8 *)(this + 0x40);
  Mat::operator=(&local_40,(Mat *)(this + 0x10));
  Mat::~Mat(&local_40);
  if (0.0 < (*(double *)(this + 0x48) - *(double *)(this + 0x40)) / *(double *)(this + 0x60)) {
    iVar3 = 0;
    do {
      Mat::GetCol(&local_50,(int)this + 0x68);
      t = *(double *)(this + 0x28);
      Mat::Mat(&local_60,(Mat *)(this + 0x10));
      h = *(double *)(this + 0x60);
      Mat::Mat(&local_70,&local_50);
      Step(this,t,&local_60,h,&local_70);
      Mat::~Mat(&local_70);
      Mat::~Mat(&local_60);
      Mat::~Mat(&local_50);
      iVar3 = iVar3 + 1;
    } while ((double)iVar3 <
             (*(double *)(this + 0x48) - *(double *)(this + 0x40)) / *(double *)(this + 0x60));
  }
  cVar2 = clock();
  *(double *)(this + 0x20) = (double)(cVar2 - cVar1) + *(double *)(this + 0x20);
  return;
}

Assistant:

void RK8::Integrate()
{
	clock_t t1 = clock();
	t_out_ = t_initial_;
	y_out_ = y_0_;
	for (int i = 0; i < (t_final_ - t_initial_) / h_; i++)
	{
		Mat input = u_vec_.GetCol(i);
		Step(t_out_, y_out_, h_, input);
	}
	time_ += (clock() - t1);
}